

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O2

void btPlaneSpace1<btVector3>(btVector3 *n,btVector3 *p,btVector3 *q)

{
  btScalar bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar2 = n->m_floats[2];
  if (ABS(fVar2) <= 0.70710677) {
    fVar2 = n->m_floats[1];
    fVar3 = n->m_floats[0] * n->m_floats[0] + fVar2 * fVar2;
    fVar4 = 1.0 / SQRT(fVar3);
    p->m_floats[0] = -fVar2 * fVar4;
    bVar1 = fVar3 * fVar4;
    fVar4 = fVar4 * n->m_floats[0];
    p->m_floats[1] = fVar4;
    p->m_floats[2] = 0.0;
    q->m_floats[0] = -n->m_floats[2] * fVar4;
    q->m_floats[1] = n->m_floats[2] * p->m_floats[0];
  }
  else {
    fVar2 = n->m_floats[1] * n->m_floats[1] + fVar2 * fVar2;
    p->m_floats[0] = 0.0;
    fVar3 = 1.0 / SQRT(fVar2);
    p->m_floats[1] = -n->m_floats[2] * fVar3;
    p->m_floats[2] = fVar3 * n->m_floats[1];
    q->m_floats[0] = fVar2 * fVar3;
    q->m_floats[1] = -n->m_floats[0] * p->m_floats[2];
    bVar1 = n->m_floats[0] * p->m_floats[1];
  }
  q->m_floats[2] = bVar1;
  return;
}

Assistant:

SIMD_FORCE_INLINE void btPlaneSpace1 (const T& n, T& p, T& q)
{
  if (btFabs(n[2]) > SIMDSQRT12) {
    // choose p in y-z plane
    btScalar a = n[1]*n[1] + n[2]*n[2];
    btScalar k = btRecipSqrt (a);
    p[0] = 0;
	p[1] = -n[2]*k;
	p[2] = n[1]*k;
    // set q = n x p
    q[0] = a*k;
	q[1] = -n[0]*p[2];
	q[2] = n[0]*p[1];
  }
  else {
    // choose p in x-y plane
    btScalar a = n[0]*n[0] + n[1]*n[1];
    btScalar k = btRecipSqrt (a);
    p[0] = -n[1]*k;
	p[1] = n[0]*k;
	p[2] = 0;
    // set q = n x p
    q[0] = -n[2]*p[1];
	q[1] = n[2]*p[0];
	q[2] = a*k;
  }
}